

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O3

int mbedtls_aes_self_test(int verbose)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  uchar (*pauVar6) [16];
  char *pcVar7;
  uint uVar8;
  int iVar9;
  size_t __n;
  uint uVar10;
  uchar (*pauVar11) [48];
  ulong uVar12;
  uchar (*pauVar13) [48];
  uchar *__s2;
  uint uVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uchar iv [16];
  uchar buf [64];
  uchar key [32];
  uchar prv [16];
  uchar nonce_counter [16];
  uchar stream_block [16];
  mbedtls_aes_context ctx;
  uchar tmp [16];
  undefined1 local_228 [16];
  uchar (*local_210) [16];
  undefined1 local_208 [16];
  uchar local_1f8 [48];
  uchar local_1c8 [16];
  undefined1 local_1b8 [16];
  size_t local_1a0;
  undefined1 local_198 [16];
  undefined8 local_188;
  undefined8 uStack_180;
  uchar local_178 [16];
  mbedtls_aes_context local_168;
  
  local_1c8[0] = '\0';
  local_1c8[1] = '\0';
  local_1c8[2] = '\0';
  local_1c8[3] = '\0';
  local_1c8[4] = '\0';
  local_1c8[5] = '\0';
  local_1c8[6] = '\0';
  local_1c8[7] = '\0';
  local_1c8[8] = '\0';
  local_1c8[9] = '\0';
  local_1c8[10] = '\0';
  local_1c8[0xb] = '\0';
  local_1c8[0xc] = '\0';
  local_1c8[0xd] = '\0';
  local_1c8[0xe] = '\0';
  local_1c8[0xf] = '\0';
  local_1b8 = (undefined1  [16])0x0;
  memset(&local_168,0,0x120);
  uVar14 = 0;
  do {
    while( true ) {
      while( true ) {
        uVar10 = (uVar14 >> 1) * 0x40 + 0x80;
        uVar8 = uVar14 & 1;
        if (verbose != 0) {
          pcVar7 = "enc";
          if (uVar8 == 0) {
            pcVar7 = "dec";
          }
          printf("  AES-ECB-%3d (%s): ",(ulong)uVar10,pcVar7);
        }
        local_208 = (undefined1  [16])0x0;
        if (uVar8 == 0) {
          iVar4 = mbedtls_aes_setkey_dec(&local_168,local_1c8,uVar10);
          pauVar6 = aes_test_ecb_dec;
        }
        else {
          iVar4 = mbedtls_aes_setkey_enc(&local_168,local_1c8,uVar10);
          pauVar6 = aes_test_ecb_enc;
        }
        if (uVar10 != 0xc0 || iVar4 != -0x23) break;
        puts("skipped");
        uVar14 = uVar14 + 1;
        if (uVar14 == 6) {
          if (verbose == 0) goto LAB_001228d1;
          goto LAB_001228c7;
        }
      }
      if (iVar4 != 0) goto LAB_00122dde;
      local_210 = pauVar6 + (uVar14 >> 1);
      iVar9 = 10000;
      do {
        iVar4 = mbedtls_aes_crypt_ecb(&local_168,uVar8,local_208,local_208);
        if (iVar4 != 0) goto LAB_00122dde;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      auVar16[0] = -((*local_210)[0] == local_208[0]);
      auVar16[1] = -((*local_210)[1] == local_208[1]);
      auVar16[2] = -((*local_210)[2] == local_208[2]);
      auVar16[3] = -((*local_210)[3] == local_208[3]);
      auVar16[4] = -((*local_210)[4] == local_208[4]);
      auVar16[5] = -((*local_210)[5] == local_208[5]);
      auVar16[6] = -((*local_210)[6] == local_208[6]);
      auVar16[7] = -((*local_210)[7] == local_208[7]);
      auVar16[8] = -((*local_210)[8] == local_208[8]);
      auVar16[9] = -((*local_210)[9] == local_208[9]);
      auVar16[10] = -((*local_210)[10] == local_208[10]);
      auVar16[0xb] = -((*local_210)[0xb] == local_208[0xb]);
      auVar16[0xc] = -((*local_210)[0xc] == local_208[0xc]);
      auVar16[0xd] = -((*local_210)[0xd] == local_208[0xd]);
      auVar16[0xe] = -((*local_210)[0xe] == local_208[0xe]);
      auVar16[0xf] = -((*local_210)[0xf] == local_208[0xf]);
      if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar16[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00122e1b;
      if (verbose != 0) break;
      uVar14 = uVar14 + 1;
      if (uVar14 == 6) goto LAB_001228d1;
    }
    puts("passed");
    uVar14 = uVar14 + 1;
  } while (uVar14 != 6);
LAB_001228c7:
  putchar(10);
LAB_001228d1:
  uVar14 = 0;
  do {
    while( true ) {
      while( true ) {
        uVar8 = (uVar14 >> 1) * 0x40 + 0x80;
        if (verbose != 0) {
          pcVar7 = "enc";
          if ((uVar14 & 1) == 0) {
            pcVar7 = "dec";
          }
          printf("  AES-CBC-%3d (%s): ",(ulong)uVar8,pcVar7);
        }
        local_228 = (undefined1  [16])0x0;
        local_198 = (undefined1  [16])0x0;
        local_208 = (undefined1  [16])0x0;
        if ((uVar14 & 1) == 0) {
          iVar4 = mbedtls_aes_setkey_dec(&local_168,local_1c8,uVar8);
          pauVar6 = aes_test_cbc_dec;
        }
        else {
          iVar4 = mbedtls_aes_setkey_enc(&local_168,local_1c8,uVar8);
          pauVar6 = aes_test_cbc_enc;
        }
        if (uVar8 != 0xc0 || iVar4 != -0x23) break;
        puts("skipped");
        uVar14 = uVar14 + 1;
        if (uVar14 == 6) {
          if (verbose == 0) goto LAB_00122a61;
          goto LAB_00122a57;
        }
      }
      if (iVar4 != 0) goto LAB_00122dde;
      local_210 = pauVar6 + (uVar14 >> 1);
      iVar9 = 10000;
      do {
        auVar16 = local_198;
        bVar15 = (uVar14 & 1) != 0;
        if (bVar15) {
          local_198 = local_208;
          local_208 = auVar16;
        }
        iVar4 = mbedtls_aes_crypt_cbc(&local_168,(uint)bVar15,0x10,local_228,local_208,local_208);
        if (iVar4 != 0) goto LAB_00122dde;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      auVar17[0] = -((*local_210)[0] == local_208[0]);
      auVar17[1] = -((*local_210)[1] == local_208[1]);
      auVar17[2] = -((*local_210)[2] == local_208[2]);
      auVar17[3] = -((*local_210)[3] == local_208[3]);
      auVar17[4] = -((*local_210)[4] == local_208[4]);
      auVar17[5] = -((*local_210)[5] == local_208[5]);
      auVar17[6] = -((*local_210)[6] == local_208[6]);
      auVar17[7] = -((*local_210)[7] == local_208[7]);
      auVar17[8] = -((*local_210)[8] == local_208[8]);
      auVar17[9] = -((*local_210)[9] == local_208[9]);
      auVar17[10] = -((*local_210)[10] == local_208[10]);
      auVar17[0xb] = -((*local_210)[0xb] == local_208[0xb]);
      auVar17[0xc] = -((*local_210)[0xc] == local_208[0xc]);
      auVar17[0xd] = -((*local_210)[0xd] == local_208[0xd]);
      auVar17[0xe] = -((*local_210)[0xe] == local_208[0xe]);
      auVar17[0xf] = -((*local_210)[0xf] == local_208[0xf]);
      if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar17[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00122e1b;
      if (verbose != 0) break;
      uVar14 = uVar14 + 1;
      if (uVar14 == 6) goto LAB_00122a61;
    }
    puts("passed");
    uVar14 = uVar14 + 1;
  } while (uVar14 != 6);
LAB_00122a57:
  putchar(10);
LAB_00122a61:
  uVar14 = 0;
  do {
    while( true ) {
      while( true ) {
        uVar10 = uVar14 >> 1;
        uVar8 = uVar10 * 0x40 + 0x80;
        if (verbose != 0) {
          pcVar7 = "enc";
          if ((uVar14 & 1) == 0) {
            pcVar7 = "dec";
          }
          printf("  AES-CFB128-%3d (%s): ",(ulong)uVar8,pcVar7);
        }
        local_228[8] = '\b';
        local_228[9] = '\t';
        local_228[10] = '\n';
        local_228[0xb] = '\v';
        local_228[0xc] = '\f';
        local_228[0xd] = '\r';
        local_228[0xe] = '\x0e';
        local_228[0xf] = '\x0f';
        local_228[0] = '\0';
        local_228[1] = '\x01';
        local_228[2] = '\x02';
        local_228[3] = '\x03';
        local_228[4] = '\x04';
        local_228[5] = '\x05';
        local_228[6] = '\x06';
        local_228[7] = '\a';
        memcpy(local_1c8,aes_test_cfb128_key + uVar10,(ulong)(uVar8 >> 3));
        iVar4 = mbedtls_aes_setkey_enc(&local_168,local_1c8,uVar8);
        if (uVar8 != 0xc0 || iVar4 != -0x23) break;
        puts("skipped");
        uVar14 = uVar14 + 1;
        if (uVar14 == 6) {
          if (verbose == 0) goto LAB_00122c8c;
          goto LAB_00122c82;
        }
      }
      if (iVar4 != 0) goto LAB_00122dde;
      if ((uVar14 & 1) == 0) {
        local_1f8._32_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar10] + 0x30);
        local_1f8._40_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar10] + 0x38);
        local_1f8._16_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar10] + 0x20);
        local_1f8._24_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar10] + 0x28);
        local_1f8._0_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar10] + 0x10);
        local_1f8._8_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar10] + 0x18);
        local_208 = *(undefined1 (*) [16])aes_test_cfb128_ct[uVar10];
        lVar5 = 0;
        uVar12 = 0;
        do {
          if (uVar12 == 0) {
            mbedtls_aes_crypt_ecb(&local_168,1,local_228,local_228);
          }
          bVar1 = local_208[lVar5];
          local_208[lVar5] = local_228[uVar12] ^ bVar1;
          local_228[uVar12] = bVar1;
          uVar12 = (ulong)((int)uVar12 + 1U & 0xf);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x40);
        __s2 = aes_test_cfb128_pt;
      }
      else {
        local_1f8[0x20] = 0xf6;
        local_1f8[0x21] = 0x9f;
        local_1f8[0x22] = '$';
        local_1f8[0x23] = 'E';
        local_1f8[0x24] = 0xdf;
        local_1f8[0x25] = 'O';
        local_1f8[0x26] = 0x9b;
        local_1f8[0x27] = '\x17';
        local_1f8[0x28] = 0xad;
        local_1f8[0x29] = '+';
        local_1f8[0x2a] = 'A';
        local_1f8[0x2b] = '{';
        local_1f8[0x2c] = 0xe6;
        local_1f8[0x2d] = 'l';
        local_1f8[0x2e] = '7';
        local_1f8[0x2f] = '\x10';
        local_1f8[0x10] = '0';
        local_1f8[0x11] = 200;
        local_1f8[0x12] = '\x1c';
        local_1f8[0x13] = 'F';
        local_1f8[0x14] = 0xa3;
        local_1f8[0x15] = '\\';
        local_1f8[0x16] = 0xe4;
        local_1f8[0x17] = '\x11';
        local_1f8[0x18] = 0xe5;
        local_1f8[0x19] = 0xfb;
        local_1f8[0x1a] = 0xc1;
        local_1f8[0x1b] = '\x19';
        local_1f8[0x1c] = '\x1a';
        local_1f8[0x1d] = '\n';
        local_1f8[0x1e] = 'R';
        local_1f8[0x1f] = 0xef;
        local_1f8[0] = 0xae;
        local_1f8[1] = '-';
        local_1f8[2] = 0x8a;
        local_1f8[3] = 'W';
        local_1f8[4] = '\x1e';
        local_1f8[5] = '\x03';
        local_1f8[6] = 0xac;
        local_1f8[7] = 0x9c;
        local_1f8[8] = 0x9e;
        local_1f8[9] = 0xb7;
        local_1f8[10] = 'o';
        local_1f8[0xb] = 0xac;
        local_1f8[0xc] = 'E';
        local_1f8[0xd] = 0xaf;
        local_1f8[0xe] = 0x8e;
        local_1f8[0xf] = 'Q';
        local_208[8] = 0xe9;
        local_208[9] = '=';
        local_208[10] = '~';
        local_208[0xb] = '\x11';
        local_208[0xc] = 's';
        local_208[0xd] = 0x93;
        local_208[0xe] = '\x17';
        local_208[0xf] = '*';
        local_208[0] = 'k';
        local_208[1] = 0xc1;
        local_208[2] = 0xbe;
        local_208[3] = 0xe2;
        local_208[4] = '.';
        local_208[5] = '@';
        local_208[6] = 0x9f;
        local_208[7] = 0x96;
        lVar5 = 0;
        uVar8 = 0;
        do {
          uVar12 = (ulong)uVar8;
          if (uVar12 == 0) {
            mbedtls_aes_crypt_ecb(&local_168,1,local_228,local_228);
          }
          bVar1 = local_208[lVar5];
          bVar2 = local_228[uVar12];
          local_208[lVar5] = bVar1 ^ bVar2;
          local_228[uVar12] = bVar1 ^ bVar2;
          uVar8 = uVar8 + 1 & 0xf;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x40);
        __s2 = aes_test_cfb128_ct[uVar10];
      }
      iVar4 = bcmp(local_208,__s2,0x40);
      if (iVar4 != 0) goto LAB_00122e1b;
      if (verbose != 0) break;
      uVar14 = uVar14 + 1;
      if (uVar14 == 6) goto LAB_00122c8c;
    }
    puts("passed");
    uVar14 = uVar14 + 1;
  } while (uVar14 != 6);
LAB_00122c82:
  putchar(10);
LAB_00122c8c:
  uVar12 = 0;
  do {
    while( true ) {
      if (verbose != 0) {
        pcVar7 = "enc";
        if ((uVar12 & 1) == 0) {
          pcVar7 = "dec";
        }
        printf("  AES-CTR-128 (%s): ",pcVar7);
      }
      uVar3 = uVar12 >> 1;
      local_188 = *(undefined8 *)aes_test_ctr_nonce_counter[uVar3];
      uStack_180 = *(undefined8 *)(aes_test_ctr_nonce_counter[uVar3] + 8);
      local_1c8 = aes_test_ctr_key[uVar3];
      local_1a0 = 0;
      iVar4 = mbedtls_aes_setkey_enc(&local_168,local_1c8,0x80);
      if (iVar4 != 0) goto LAB_00122dde;
      __n = (size_t)aes_test_ctr_len[uVar3];
      pauVar11 = aes_test_ctr_pt;
      pauVar13 = aes_test_ctr_ct;
      if ((uVar12 & 1) == 0) {
        pauVar11 = aes_test_ctr_ct;
        pauVar13 = aes_test_ctr_pt;
      }
      memcpy(local_208,pauVar11 + uVar3,__n);
      mbedtls_aes_crypt_ctr
                (&local_168,__n,&local_1a0,(uchar *)&local_188,local_178,local_208,local_208);
      iVar4 = bcmp(local_208,pauVar13 + uVar3,__n);
      if (iVar4 != 0) goto LAB_00122e1b;
      if (verbose == 0) break;
      puts("passed");
      uVar14 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar14;
      if (uVar14 == 6) {
        putchar(10);
        iVar4 = 0;
        goto LAB_00122df1;
      }
    }
    uVar14 = (int)uVar12 + 1;
    uVar12 = (ulong)uVar14;
    iVar4 = 0;
  } while (uVar14 != 6);
LAB_00122df1:
  lVar5 = 0;
  do {
    *(undefined1 *)((long)local_168.buf + lVar5 + -0x10) = 0;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x120);
  return iVar4;
LAB_00122e1b:
  iVar4 = 1;
LAB_00122dde:
  if (verbose != 0) {
    puts("failed");
  }
  goto LAB_00122df1;
}

Assistant:

int mbedtls_aes_self_test( int verbose )
{
    int ret = 0, i, j, u, mode;
    unsigned int keybits;
    unsigned char key[32];
    unsigned char buf[64];
    const unsigned char *aes_tests;
#if defined(MBEDTLS_CIPHER_MODE_CBC) || defined(MBEDTLS_CIPHER_MODE_CFB)
    unsigned char iv[16];
#endif
#if defined(MBEDTLS_CIPHER_MODE_CBC)
    unsigned char prv[16];
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR) || defined(MBEDTLS_CIPHER_MODE_CFB)
    size_t offset;
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR)
    int len;
    unsigned char nonce_counter[16];
    unsigned char stream_block[16];
#endif
    mbedtls_aes_context ctx;

    memset( key, 0, 32 );
    mbedtls_aes_init( &ctx );

    /*
     * ECB mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-ECB-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( buf, 0, 16 );

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            ret = mbedtls_aes_setkey_dec( &ctx, key, keybits );
            aes_tests = aes_test_ecb_dec[u];
        }
        else
        {
            ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
            aes_tests = aes_test_ecb_enc[u];
        }

        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_AES_FEATURE_UNAVAILABLE && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        for( j = 0; j < 10000; j++ )
        {
            ret = mbedtls_aes_crypt_ecb( &ctx, mode, buf, buf );
            if( ret != 0 )
                goto exit;
        }

        if( memcmp( buf, aes_tests, 16 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    /*
     * CBC mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CBC-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( iv , 0, 16 );
        memset( prv, 0, 16 );
        memset( buf, 0, 16 );

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            ret = mbedtls_aes_setkey_dec( &ctx, key, keybits );
            aes_tests = aes_test_cbc_dec[u];
        }
        else
        {
            ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
            aes_tests = aes_test_cbc_enc[u];
        }

        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_AES_FEATURE_UNAVAILABLE && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        for( j = 0; j < 10000; j++ )
        {
            if( mode == MBEDTLS_AES_ENCRYPT )
            {
                unsigned char tmp[16];

                memcpy( tmp, prv, 16 );
                memcpy( prv, buf, 16 );
                memcpy( buf, tmp, 16 );
            }

            ret = mbedtls_aes_crypt_cbc( &ctx, mode, 16, iv, buf, buf );
            if( ret != 0 )
                goto exit;

        }

        if( memcmp( buf, aes_tests, 16 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CBC */

#if defined(MBEDTLS_CIPHER_MODE_CFB)
    /*
     * CFB128 mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CFB128-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( iv,  aes_test_cfb128_iv, 16 );
        memcpy( key, aes_test_cfb128_key[u], keybits / 8 );

        offset = 0;
        ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_AES_FEATURE_UNAVAILABLE && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            memcpy( buf, aes_test_cfb128_ct[u], 64 );
            aes_tests = aes_test_cfb128_pt;
        }
        else
        {
            memcpy( buf, aes_test_cfb128_pt, 64 );
            aes_tests = aes_test_cfb128_ct[u];
        }

        ret = mbedtls_aes_crypt_cfb128( &ctx, mode, 64, &offset, iv, buf, buf );
        if( ret != 0 )
            goto exit;

        if( memcmp( buf, aes_tests, 64 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CFB */

#if defined(MBEDTLS_CIPHER_MODE_CTR)
    /*
     * CTR mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CTR-128 (%s): ",
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( nonce_counter, aes_test_ctr_nonce_counter[u], 16 );
        memcpy( key, aes_test_ctr_key[u], 16 );

        offset = 0;
        if( ( ret = mbedtls_aes_setkey_enc( &ctx, key, 128 ) ) != 0 )
            goto exit;

        len = aes_test_ctr_len[u];

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            memcpy( buf, aes_test_ctr_ct[u], len );
            aes_tests = aes_test_ctr_pt[u];
        }
        else
        {
            memcpy( buf, aes_test_ctr_pt[u], len );
            aes_tests = aes_test_ctr_ct[u];
        }

        ret = mbedtls_aes_crypt_ctr( &ctx, len, &offset, nonce_counter,
                                     stream_block, buf, buf );
        if( ret != 0 )
            goto exit;

        if( memcmp( buf, aes_tests, len ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CTR */

    ret = 0;

exit:
    if( ret != 0 && verbose != 0 )
        mbedtls_printf( "failed\n" );

    mbedtls_aes_free( &ctx );

    return( ret );
}